

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphElements.cpp
# Opt level: O2

vector<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_> * __thiscall
dg::vr::VRLocation::getPredLocations
          (vector<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_>
           *__return_storage_ptr__,VRLocation *this)

{
  pointer ppVVar1;
  pointer ppVVar2;
  
  (__return_storage_ptr__->
  super__Vector_base<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ppVVar1 = (this->predecessors).
            super__Vector_base<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppVVar2 = (this->predecessors).
                 super__Vector_base<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppVVar2 != ppVVar1; ppVVar2 = ppVVar2 + 1) {
    std::vector<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_>::push_back
              (__return_storage_ptr__,&(*ppVVar2)->source);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<VRLocation *> VRLocation::getPredLocations() {
    std::vector<VRLocation *> result;
    for (VREdge *edge : predecessors) {
        result.push_back(edge->source);
    }
    return result;
}